

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O0

string_view __thiscall ritobin::io::impl_text_read::TextReader::read_word(TextReader *this)

{
  char *__str;
  bool bVar1;
  bool local_33;
  bool local_32;
  bool local_31;
  char *beg;
  TextReader *this_local;
  
  while( true ) {
    bVar1 = is_eof(this);
    local_31 = false;
    if (!bVar1) {
      local_31 = one_of<(char)32,(char)9,(char)13>(*this->cur_);
    }
    if (local_31 == false) break;
    this->cur_ = this->cur_ + 1;
  }
  __str = this->cur_;
  while( true ) {
    bVar1 = is_eof(this);
    local_32 = false;
    if (!bVar1) {
      bVar1 = one_of<(char)95,(char)43,(char)45,(char)46>(*this->cur_);
      local_33 = true;
      if (!bVar1) {
        bVar1 = in_range<(char)65,(char)90>(*this->cur_);
        local_33 = true;
        if (!bVar1) {
          bVar1 = in_range<(char)97,(char)122>(*this->cur_);
          local_33 = true;
          if (!bVar1) {
            local_33 = in_range<(char)48,(char)57>(*this->cur_);
          }
        }
      }
      local_32 = local_33;
    }
    if (local_32 == false) break;
    this->cur_ = this->cur_ + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__str,
             (long)this->cur_ - (long)__str);
  return _this_local;
}

Assistant:

constexpr std::string_view read_word() noexcept {
            while (!is_eof() && one_of<' ', '\t', '\r'>(*cur_)) {
                cur_++;
            }
            auto const beg = cur_;
            while (!is_eof() && (one_of<'_', '+', '-', '.'>(*cur_)
                || in_range<'A', 'Z'>(*cur_)
                || in_range<'a', 'z'>(*cur_)
                || in_range<'0', '9'>(*cur_))) {
                cur_++;
            }
            return { beg, static_cast<size_t>(cur_ - beg) };
        }